

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

void __thiscall
helics::ValueFederate::registerValueInterfacesJsonDetail
          (ValueFederate *this,JsonBuffer *jsonBuff,bool defaultGlobal)

{
  Publication *pPVar1;
  value_t vVar2;
  string_view units_00;
  string_view units_01;
  string_view units_02;
  string_view units_03;
  string_view units_04;
  size_type sVar3;
  bool bVar4;
  iterator iVar5;
  const_reference pvVar6;
  undefined8 extraout_RAX;
  const_iterator cVar7;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this_00;
  const_iterator cVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_class_8_1_66e10193 callback;
  reference pbVar10;
  anon_class_8_1_6bff8b70 callback_00;
  reference pbVar11;
  anon_class_8_1_ba1d534b callback_01;
  undefined7 in_register_00000011;
  char cVar12;
  undefined1 uVar13;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this_01;
  data *pdVar14;
  string_view key;
  string_view key_00;
  string_view name_00;
  string_view info_00;
  string_view newTarget;
  string_view newTarget_00;
  string_view newTarget_01;
  string_view key_01;
  string_view target;
  string_view key_02;
  string_view key_03;
  string_view name_01;
  string_view type;
  string_view type_00;
  string_view type_01;
  string_view type_02;
  string_view type_03;
  iterator __begin4;
  string info;
  bool ret;
  string units;
  string name_1;
  string units_1;
  value_type targets;
  const_iterator __begin2;
  string name;
  const_iterator __end2;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [32];
  undefined1 local_238 [16];
  undefined1 auStack_228 [16];
  undefined1 local_218 [16];
  undefined1 auStack_208 [8];
  undefined1 auStack_200 [24];
  key_type local_1e8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  data local_1a8;
  key_type local_198;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_178;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_170;
  string local_168;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  data *local_a8;
  string local_a0;
  string local_80;
  ValueFederate *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_58;
  ValueFederate *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_48;
  ValueFederate *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_38;
  
  auStack_200._20_4_ = (undefined4)CONCAT71(in_register_00000011,defaultGlobal);
  this_01 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             *)jsonBuff->reference;
  local_278._0_8_ = local_268;
  auStack_200._8_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"defaultglobal","");
  if ((this_01->field_0x0 == '\x01') &&
     (iVar5 = CLI::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
              ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                       **)(this_01 + 8),(key_type *)local_278),
     iVar5._M_node != (_Base_ptr)(*(long *)(this_01 + 8) + 8))) {
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)this_01,(key_type *)local_278);
    local_238._0_8_ = local_238._0_8_ & 0xffffffffffffff00;
    nlohmann::json_abi_v3_11_3::detail::
    from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              (pvVar6,(boolean_t *)local_238);
    auStack_200._20_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_238[0]);
  }
  if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
  }
  this_00 = this_01;
  if ((this_01->field_0x0 == '\x01') &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[11],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(this_01 + 8),(char (*) [11])0x3dfdf5),
     cVar7._M_node != (_Base_ptr)(*(long *)(this_01 + 8) + 8))) {
    this_00 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(this_01,"interfaces");
  }
  local_170 = this_01;
  if ((*this_00 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[13],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(this_00 + 8),(char (*) [13])0x3dfd9b),
     cVar8._M_node != (_Base_ptr)(*(long *)(this_00 + 8) + 8))) {
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(this_00,"publications");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)&local_198,pvVar6);
    vVar2 = (pvVar6->m_data).m_type;
    local_148.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_148.m_it.array_iterator._M_current = (pointer)0x0;
    local_148.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar2 == array) {
      local_148.m_it.array_iterator._M_current =
           (((pvVar6->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar2 == object) {
      local_148.m_it.object_iterator._M_node =
           &(((pvVar6->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_148.m_it.primitive_iterator.m_it = 1;
    }
    local_178 = this_00;
    local_148.m_object = pvVar6;
    bVar4 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)&local_198,&local_148);
    this_00 = local_178;
    this_01 = local_170;
    if (!bVar4) {
      do {
        pbVar11 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_198);
        fileops::getName(&local_168,pbVar11);
        key._M_str = local_168._M_dataplus._M_p;
        key._M_len = local_168._M_string_length;
        callback.pubAct =
             ValueFederateManager::getPublication
                       ((((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                           *)(auStack_200._8_8_ + 8))->_M_t).
                        super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                        .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,
                        key);
        if (((callback.pubAct)->super_Interface).handle.hid == -1700000000) {
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"type","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)local_278);
            if ((pvVar6->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((string *)local_238,pvVar6);
            }
            else {
              fileops::generateJsonString((string *)local_238,pvVar6,true);
            }
          }
          else {
            local_238._0_8_ = auStack_228;
            local_238._8_8_ = (_Base_ptr)0x0;
            auStack_228._0_8_ = auStack_228._0_8_ & 0xffffffffffffff00;
          }
          if ((undefined1 *)local_278._0_8_ != local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"unit","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)local_278);
            if ((pvVar6->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((string *)local_218,pvVar6);
            }
            else {
              fileops::generateJsonString((string *)local_218,pvVar6,true);
            }
          }
          else {
            local_218._0_8_ = auStack_208;
            local_218._8_8_ = (ValueFederate *)0x0;
            auStack_208 = (undefined1  [8])((ulong)auStack_208 & 0xffffffffffffff00);
          }
          if ((undefined1 *)local_278._0_8_ != local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          local_1e8._M_dataplus._M_p = (pointer)((long)&local_1e8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_200 + 0x18),"units","")
          ;
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,
                             (key_type *)(auStack_200 + 0x18)),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)(auStack_200 + 0x18));
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((key_type *)local_278,pvVar6);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218
                      ,(key_type *)local_278);
            if ((undefined1 *)local_278._0_8_ != local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_1e8 + 0x10U)) {
            operator_delete(local_1e8._M_dataplus._M_p,
                            CONCAT26(local_1e8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_1e8.field_2._M_local_buf[5],
                                              CONCAT14(local_1e8.field_2._M_local_buf[4],
                                                       local_1e8.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"global","");
          uVar13 = (char)auStack_200._20_4_;
          if ((pbVar11->m_data).m_type == object) {
            iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278);
            uVar13 = (char)auStack_200._20_4_;
            if ((_Rb_tree_header *)iVar5._M_node !=
                &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::operator[](pbVar11,(key_type *)local_278);
              local_1e8._M_dataplus._M_p = local_1e8._M_dataplus._M_p & 0xffffffffffffff00;
              nlohmann::json_abi_v3_11_3::detail::
              from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        (pvVar6,(boolean_t *)(auStack_200 + 0x18));
              uVar13 = local_1e8._M_dataplus._M_p._0_1_;
            }
          }
          if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          if (uVar13 == '\0') {
            local_40 = (ValueFederate *)local_218._8_8_;
            paStack_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_218._0_8_;
            units_01._M_str = (char *)local_218._0_8_;
            units_01._M_len = local_218._8_8_;
            name_00._M_str = local_168._M_dataplus._M_p;
            name_00._M_len = local_168._M_string_length;
            type_00._M_str = (char *)local_238._0_8_;
            type_00._M_len = local_238._8_8_;
            callback.pubAct =
                 registerPublication((ValueFederate *)auStack_200._8_8_,name_00,type_00,units_01);
          }
          else {
            local_278._0_8_ = local_218._8_8_;
            local_278._8_8_ = local_218._0_8_;
            units_00._M_str = (char *)local_218._0_8_;
            units_00._M_len = local_218._8_8_;
            key_00._M_str = local_168._M_dataplus._M_p;
            key_00._M_len = local_168._M_string_length;
            type._M_str = (char *)local_238._0_8_;
            type._M_len = local_238._8_8_;
            callback.pubAct =
                 ValueFederateManager::registerPublication
                           ((((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                               *)(auStack_200._8_8_ + 8))->_M_t).
                            super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                            .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                            _M_head_impl,key_00,type,units_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_208) {
            operator_delete((void *)local_218._0_8_,(ulong)((long)auStack_208 + 1));
          }
          if ((data *)local_238._0_8_ != (data *)auStack_228) {
            operator_delete((void *)local_238._0_8_,(ulong)(auStack_228._0_8_ + 1));
          }
        }
        local_1e8._M_dataplus._M_p = (pointer)((long)&local_1e8 + 0x10);
        local_1e8.field_2._M_local_buf[4] = 's';
        local_1e8.field_2._M_allocated_capacity._0_4_ = 0x67616c66;
        local_1e8._M_string_length = 5;
        local_1e8.field_2._M_local_buf[5] = '\0';
        local_258._8_8_ = auStack_200._8_8_;
        local_258._0_8_ = callback.pubAct;
        if (((pbVar11->m_data).m_type == object) &&
           (iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,
                           (key_type *)(auStack_200 + 0x18)),
           (_Rb_tree_header *)iVar5._M_node !=
           &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pbVar11,(key_type *)(auStack_200 + 0x18));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_1a8,pvVar6);
          if (local_1a8.m_type == array) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::begin((iterator *)local_278,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&local_1a8);
            auStack_228._8_8_ = (code *)0x8000000000000000;
            auStack_228._0_8_ =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)0x0;
            local_238._8_8_ = (_Base_ptr)0x0;
            local_238._0_8_ = &local_1a8;
            if (local_1a8.m_type == array) {
              auStack_228._0_8_ =
                   ((local_1a8.m_value.array)->
                   super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
            }
            else if (local_1a8.m_type == object) {
              local_238._8_8_ = &((local_1a8.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
            }
            else {
              auStack_228._8_8_ = (code *)0x1;
            }
            while (bVar4 = nlohmann::json_abi_v3_11_3::detail::
                           iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           ::
                           operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                     ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)local_278,
                                      (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)local_238), !bVar4) {
              pbVar10 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                     *)local_278);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((string *)local_218,pbVar10);
              loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Publication>
              ::anon_class_16_2_5e8ce78e::operator()
                        ((anon_class_16_2_5e8ce78e *)local_258,(string *)local_218);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auStack_208) {
                operator_delete((void *)local_218._0_8_,(ulong)((long)auStack_208 + 1));
              }
              if (*(undefined1 *)local_278._0_8_ == 2) {
                local_268._0_8_ = local_268._0_8_ + 0x10;
              }
              else if (*(undefined1 *)local_278._0_8_ == _S_black) {
                local_278._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_278._8_8_);
              }
              else {
                local_268._8_8_ = local_268._8_8_ + 1;
              }
            }
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((key_type *)local_278,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_1a8);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Publication>
            ::anon_class_16_2_5e8ce78e::operator()
                      ((anon_class_16_2_5e8ce78e *)local_258,(string *)local_278);
            if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_1a8);
        }
        if (((*(char *)((long)local_1e8._M_dataplus._M_p + -1 + local_1e8._M_string_length) == 's')
            && (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (auStack_200 + 0x18)), (pbVar11->m_data).m_type == object)) &&
           (iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,
                           (key_type *)(auStack_200 + 0x18)),
           (_Rb_tree_header *)iVar5._M_node !=
           &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pbVar11,(key_type *)(auStack_200 + 0x18));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((key_type *)local_278,pvVar6);
          loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Publication>
          ::anon_class_16_2_5e8ce78e::operator()
                    ((anon_class_16_2_5e8ce78e *)local_258,(string *)local_278);
          if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_1e8 + 0x10U)) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          CONCAT26(local_1e8.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_1e8.field_2._M_local_buf[5],
                                            CONCAT14(local_1e8.field_2._M_local_buf[4],
                                                     local_1e8.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_278._0_8_ = (pointer)0x0;
        local_278._8_8_ = 0;
        local_268._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
             ::_M_invoke;
        local_268._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
             ::_M_manager;
        local_238._0_8_ = (pointer)0x0;
        local_238._8_8_ = (_Base_ptr)0x0;
        auStack_228._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
             ::_M_invoke;
        auStack_228._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
             ::_M_manager;
        local_218._8_8_ = (_Base_ptr)0x0;
        auStack_200._0_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
             ::_M_invoke;
        auStack_208 = (undefined1  [8])
                      std::
                      _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
                      ::_M_manager;
        local_218._0_8_ = callback.pubAct;
        processOptions(pbVar11,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)local_278,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_238,(function<void_(int,_int)> *)local_218);
        if (auStack_208 != (undefined1  [8])0x0) {
          (*(code *)auStack_208)((string *)local_218,(string *)local_218,3);
        }
        if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)auStack_228._0_8_ !=
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)0x0) {
          (*(code *)auStack_228._0_8_)((string *)local_238,(string *)local_238,3);
        }
        if ((_func_int **)local_268._0_8_ != (_func_int **)0x0) {
          (*(code *)local_268._0_8_)((key_type *)local_278,(key_type *)local_278,3);
        }
        local_238._0_8_ = auStack_228;
        local_238._8_8_ = (_Base_ptr)0x5;
        auStack_228._0_6_ = 0x7361696c61;
        local_218._8_8_ = auStack_200._8_8_;
        auStack_200._0_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
             ::_M_invoke;
        auStack_208 = (undefined1  [8])
                      std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
                      ::_M_manager;
        local_218._0_8_ = callback.pubAct;
        if (((pbVar11->m_data).m_type == object) &&
           (iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_238),
           (_Rb_tree_header *)iVar5._M_node !=
           &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pbVar11,(key_type *)local_238);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((key_type *)local_278,pvVar6);
          if (auStack_208 == (undefined1  [8])0x0) {
            std::__throw_bad_function_call();
          }
          (*(code *)auStack_200._0_8_)((string *)local_218,(key_type *)local_278);
          if ((undefined1 *)local_278._0_8_ != local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
        }
        if (auStack_208 != (undefined1  [8])0x0) {
          (*(code *)auStack_208)((string *)local_218,(string *)local_218,3);
        }
        if ((data *)local_238._0_8_ != (data *)auStack_228) {
          operator_delete((void *)local_238._0_8_,(ulong)(auStack_228._0_8_ + 1));
        }
        local_278._0_8_ = local_268;
        local_268._0_8_ = (_func_int **)0x636e6172656c6f74;
        local_278._8_8_ = 9;
        local_268._8_2_ = 0x65;
        pdVar14 = (data *)0xbff0000000000000;
        if ((pbVar11->m_data).m_type == object) {
          iVar5 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278);
          pdVar14 = (data *)0xbff0000000000000;
          if ((_Rb_tree_header *)iVar5._M_node !=
              &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)local_278);
            local_238._0_8_ = (data *)0x0;
            nlohmann::json_abi_v3_11_3::detail::
            get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                      (pvVar6,(double *)local_238);
            pdVar14 = (data *)local_238._0_8_;
          }
        }
        if ((undefined1 *)local_278._0_8_ != local_268) {
          local_a8 = pdVar14;
          operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
          pdVar14 = local_a8;
        }
        if (0.0 < (double)pdVar14) {
          if ((callback.pubAct)->delta <= 0.0 && (callback.pubAct)->delta != 0.0) {
            (callback.pubAct)->changeDetectionEnabled = true;
          }
          (callback.pubAct)->delta = (double)pdVar14;
        }
        local_278._0_8_ = local_268;
        local_278._8_8_ = 4;
        local_268._0_5_ = 0x6f666e69;
        if (((pbVar11->m_data).m_type == object) &&
           (iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278),
           (_Rb_tree_header *)iVar5._M_node !=
           &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pbVar11,(key_type *)local_278);
          if ((pvVar6->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_258,pvVar6);
          }
          else {
            fileops::generateJsonString((string *)local_258,pvVar6,true);
          }
        }
        else {
          local_258._0_8_ = local_258 + 0x10;
          local_258._8_8_ = (ValueFederate *)0x0;
          local_258[0x10] = '\0';
        }
        if ((undefined1 *)local_278._0_8_ != local_268) {
          operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
        }
        if ((ValueFederate *)local_258._8_8_ != (ValueFederate *)0x0) {
          info_00._M_str = (char *)local_258._0_8_;
          info_00._M_len = local_258._8_8_;
          Interface::setInfo(&(callback.pubAct)->super_Interface,info_00);
        }
        local_278._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_268._8_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
             ::_M_invoke;
        local_268._0_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
             ::_M_manager;
        local_278._0_8_ = callback.pubAct;
        loadTags(pbVar11,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)local_278);
        if ((_func_int **)local_268._0_8_ != (_func_int **)0x0) {
          (*(code *)local_268._0_8_)((key_type *)local_278,(key_type *)local_278,3);
        }
        local_1c8._0_8_ = &local_1b8;
        local_1b8._M_local_buf[0] = 't';
        local_1b8._M_allocated_capacity._1_2_ = 0x7261;
        local_1b8._M_allocated_capacity._3_4_ = 0x73746567;
        local_1c8._8_8_ = (ValueFederate *)0x7;
        local_1b8._M_local_buf[7] = '\0';
        if (((pbVar11->m_data).m_type == object) &&
           (iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_1c8),
           (_Rb_tree_header *)iVar5._M_node !=
           &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pbVar11,(key_type *)local_1c8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_1a8,pvVar6);
          if (local_1a8.m_type == array) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::begin((iterator *)local_278,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&local_1a8);
            auStack_228._8_8_ = (code *)0x8000000000000000;
            auStack_228._0_8_ =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)0x0;
            local_238._8_8_ = (_Base_ptr)0x0;
            local_238._0_8_ = &local_1a8;
            if (local_1a8.m_type == array) {
              auStack_228._0_8_ =
                   ((local_1a8.m_value.array)->
                   super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
            }
            else if (local_1a8.m_type == object) {
              local_238._8_8_ = &((local_1a8.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
            }
            else {
              auStack_228._8_8_ = (code *)0x1;
            }
            while (bVar4 = nlohmann::json_abi_v3_11_3::detail::
                           iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           ::
                           operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                     ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)local_278,
                                      (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)local_238), !bVar4) {
              pbVar10 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                     *)local_278);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((string *)local_218,pbVar10);
              newTarget_00._M_str = (char *)local_218._0_8_;
              newTarget_00._M_len = local_218._8_8_;
              Interface::addDestinationTarget
                        (&(callback.pubAct)->super_Interface,newTarget_00,UNKNOWN);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auStack_208) {
                operator_delete((void *)local_218._0_8_,(ulong)((long)auStack_208 + 1));
              }
              if (*(char *)local_278._0_8_ == '\x02') {
                local_268._0_8_ = local_268._0_8_ + 0x10;
              }
              else if (*(char *)local_278._0_8_ == '\x01') {
                local_278._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_278._8_8_);
              }
              else {
                local_268._8_8_ = local_268._8_8_ + 1;
              }
            }
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((key_type *)local_278,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_1a8);
            newTarget._M_str = (char *)local_278._0_8_;
            newTarget._M_len = local_278._8_8_;
            Interface::addDestinationTarget(&(callback.pubAct)->super_Interface,newTarget,UNKNOWN);
            if ((Publication *)local_278._0_8_ != (Publication *)local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_1a8);
        }
        if (((((char *)(local_1c8._0_8_ + -1))[local_1c8._8_8_] == 's') &&
            (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8
                     ), (pbVar11->m_data).m_type == object)) &&
           (iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_1c8),
           (_Rb_tree_header *)iVar5._M_node !=
           &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pbVar11,(key_type *)local_1c8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((key_type *)local_278,pvVar6);
          newTarget_01._M_str = (char *)local_278._0_8_;
          newTarget_01._M_len = local_278._8_8_;
          Interface::addDestinationTarget(&(callback.pubAct)->super_Interface,newTarget_01,UNKNOWN);
          if ((Publication *)local_278._0_8_ != (Publication *)local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._0_8_ != &local_1b8) {
          operator_delete((void *)local_1c8._0_8_,
                          CONCAT17(local_1b8._M_local_buf[7],
                                   CONCAT43(local_1b8._M_allocated_capacity._3_4_,
                                            CONCAT21(local_1b8._M_allocated_capacity._1_2_,
                                                     local_1b8._M_local_buf[0]))) + 1);
        }
        if ((Publication *)local_258._0_8_ != (Publication *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
        }
        local_278._0_8_ = local_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"destination","");
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"inputs","");
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__0>
                  (pbVar11,(string *)local_278,&local_c8,callback);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_278._0_8_ != local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
        }
        local_278._0_8_ = local_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"destination","");
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"targets","");
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__0>
                  (pbVar11,(string *)local_278,&local_e8,callback);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if (*local_198._M_dataplus._M_p == '\x02') {
          local_198.field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity + 0x10;
        }
        else if (*local_198._M_dataplus._M_p == '\x01') {
          local_198._M_string_length =
               std::_Rb_tree_increment((_Rb_tree_node_base *)local_198._M_string_length);
        }
        else {
          local_198.field_2._8_8_ = local_198.field_2._8_8_ + 1;
        }
        bVar4 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_198,&local_148);
        this_00 = local_178;
        this_01 = local_170;
      } while (!bVar4);
    }
  }
  if ((*this_00 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[14],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(this_00 + 8),(char (*) [14])"subscriptions"),
     cVar7._M_node != (_Base_ptr)(*(long *)(this_00 + 8) + 8))) {
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"subscriptions");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)local_238,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)paVar9);
    auStack_200._0_8_ = -0.0;
    auStack_208 = (undefined1  [8])0x0;
    local_218._8_8_ = (ValueFederate *)0x0;
    if (paVar9->_M_local_buf[0] == '\x02') {
      auStack_208 = (undefined1  [8])
                    (((json_value *)((long)paVar9 + 8))->array->
                    super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (paVar9->_M_local_buf[0] == '\x01') {
      local_218._8_8_ =
           &(((json_value *)((long)paVar9 + 8))->object->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      auStack_200._0_8_ = 4.94065645841247e-324;
    }
    local_218._0_8_ = paVar9;
    local_178 = this_00;
    bVar4 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)local_238,
                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)local_218);
    this_00 = local_178;
    this_01 = local_170;
    if (!bVar4) {
      do {
        pbVar11 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)local_238);
        fileops::getName((string *)(auStack_200 + 0x18),pbVar11);
        sVar3 = local_1e8._M_string_length;
        if ((double)local_1e8._M_string_length == 0.0) {
          local_258._0_8_ = local_258 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"target","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_258),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)local_258);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_278,pvVar6);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (auStack_200 + 0x18),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278
                     );
            if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
          }
          if ((Publication *)local_258._0_8_ != (Publication *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
          }
        }
        key_01._M_str = local_1e8._M_dataplus._M_p;
        key_01._M_len = local_1e8._M_string_length;
        callback_00.subAct =
             ValueFederateManager::getInputByTarget
                       ((((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                           *)(auStack_200._8_8_ + 8))->_M_t).
                        super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                        .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,
                        key_01);
        if (((callback_00.subAct)->super_Interface).handle.hid == -1700000000) {
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"type","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)local_278);
            if ((pvVar6->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (local_258,pvVar6);
            }
            else {
              fileops::generateJsonString((string *)local_258,pvVar6,true);
            }
          }
          else {
            local_258._0_8_ = local_258 + 0x10;
            local_258._8_8_ = (ValueFederate *)0x0;
            local_258[0x10] = '\0';
          }
          if ((undefined1 *)local_278._0_8_ != local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"unit","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)local_278);
            if ((pvVar6->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (local_1c8,pvVar6);
            }
            else {
              fileops::generateJsonString((string *)local_1c8,pvVar6,true);
            }
          }
          else {
            local_1c8._0_8_ = &local_1b8;
            local_1c8._8_8_ = (ValueFederate *)0x0;
            local_1b8._M_local_buf[0] = '\0';
          }
          if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"units","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,&local_198),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,&local_198);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_278,pvVar6);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278);
            if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          local_50 = (ValueFederate *)local_1c8._8_8_;
          paStack_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1c8._0_8_;
          units_02._M_str = (char *)local_1c8._0_8_;
          units_02._M_len = local_1c8._8_8_;
          type_01._M_str = (char *)local_258._0_8_;
          type_01._M_len = local_258._8_8_;
          callback_00.subAct =
               registerInput((ValueFederate *)auStack_200._8_8_,(string_view)ZEXT816(0),type_01,
                             units_02);
          if ((double)sVar3 != 0.0) {
            target._M_str = local_1e8._M_dataplus._M_p;
            target._M_len = local_1e8._M_string_length;
            Input::addPublication(callback_00.subAct,target);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != &local_1b8) {
            operator_delete((void *)local_1c8._0_8_,
                            CONCAT17(local_1b8._M_local_buf[7],
                                     CONCAT43(local_1b8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_1b8._M_allocated_capacity._1_2_,
                                                       local_1b8._M_local_buf[0]))) + 1);
          }
          if ((Publication *)local_258._0_8_ != (Publication *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
          }
        }
        pPVar1 = (Publication *)(local_258 + 0x10);
        local_258._0_8_ = pPVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"default","");
        if (((pbVar11->m_data).m_type == object) &&
           (iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_258),
           (_Rb_tree_header *)iVar5._M_node !=
           &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pbVar11,(key_type *)local_258);
          if ((pvVar6->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_278,pvVar6);
          }
          else {
            fileops::generateJsonString((string *)local_278,pvVar6,true);
          }
        }
        else {
          local_278._0_8_ = local_268;
          local_278._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_268._0_8_ = local_268._0_8_ & 0xffffffffffffff00;
        }
        if ((Publication *)local_258._0_8_ != pPVar1) {
          operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::
          variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
          ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       *)&(callback_00.subAct)->lastValue,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278
                     );
        }
        loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>
                  ((ValueFederate *)auStack_200._8_8_,pbVar11,callback_00.subAct);
        local_258._0_8_ = pPVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"source","");
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"publications","");
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__1>
                  (pbVar11,(string *)local_258,&local_80,callback_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((Publication *)local_258._0_8_ != pPVar1) {
          operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
        }
        local_258._0_8_ = pPVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"source","");
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"targets","");
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__1>
                  (pbVar11,(string *)local_258,&local_a0,callback_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((Publication *)local_258._0_8_ != pPVar1) {
          operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
        }
        if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_1e8 + 0x10U)) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          CONCAT26(local_1e8.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_1e8.field_2._M_local_buf[5],
                                            CONCAT14(local_1e8.field_2._M_local_buf[4],
                                                     local_1e8.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if (*(char *)local_238._0_8_ == '\x02') {
          auStack_228._0_8_ = auStack_228._0_8_ + 0x10;
        }
        else if (*(char *)local_238._0_8_ == '\x01') {
          local_238._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_238._8_8_);
        }
        else {
          auStack_228._8_8_ = auStack_228._8_8_ + 1;
        }
        bVar4 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)local_238,
                           (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)local_218);
        this_00 = local_178;
        this_01 = local_170;
      } while (!bVar4);
    }
  }
  if ((*this_00 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[7],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(this_00 + 8),(char (*) [7])0x3dfdb2),
     cVar8._M_node != (_Base_ptr)(*(long *)(this_00 + 8) + 8))) {
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"inputs");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)local_238,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)paVar9);
    auStack_200._0_8_ = -0.0;
    auStack_208 = (undefined1  [8])0x0;
    local_218._8_8_ = (ValueFederate *)0x0;
    if (paVar9->_M_local_buf[0] == '\x02') {
      auStack_208 = (undefined1  [8])
                    (((json_value *)((long)paVar9 + 8))->array->
                    super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (paVar9->_M_local_buf[0] == '\x01') {
      local_218._8_8_ =
           &(((json_value *)((long)paVar9 + 8))->object->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      auStack_200._0_8_ = 4.94065645841247e-324;
    }
    local_218._0_8_ = paVar9;
    bVar4 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)local_238,
                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)local_218);
    this_01 = local_170;
    if (!bVar4) {
      do {
        pbVar11 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)local_238);
        fileops::getName((string *)(auStack_200 + 0x18),pbVar11);
        key_02._M_str = local_1e8._M_dataplus._M_p;
        key_02._M_len = local_1e8._M_string_length;
        callback_01.inp =
             ValueFederateManager::getInput
                       ((((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                           *)(auStack_200._8_8_ + 8))->_M_t).
                        super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                        .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,
                        key_02);
        if (((callback_01.inp)->super_Interface).handle.hid == -1700000000) {
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"type","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)local_278);
            if ((pvVar6->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((string *)local_258,pvVar6);
            }
            else {
              fileops::generateJsonString((string *)local_258,pvVar6,true);
            }
          }
          else {
            local_258._0_8_ = local_258 + 0x10;
            local_258._8_8_ = (ValueFederate *)0x0;
            local_258[0x10] = '\0';
          }
          if ((undefined1 *)local_278._0_8_ != local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"unit","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,(key_type *)local_278);
            if ((pvVar6->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (local_1c8,pvVar6);
            }
            else {
              fileops::generateJsonString((string *)local_1c8,pvVar6,true);
            }
          }
          else {
            local_1c8._0_8_ = &local_1b8;
            local_1c8._8_8_ = (ValueFederate *)0x0;
            local_1b8._M_local_buf[0] = '\0';
          }
          if ((undefined1 *)local_278._0_8_ != local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"units","");
          if (((pbVar11->m_data).m_type == object) &&
             (iVar5 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(&((pbVar11->m_data).m_value.object)->_M_t,&local_198),
             (_Rb_tree_header *)iVar5._M_node !=
             &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[](pbVar11,&local_198);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_278,pvVar6);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278);
            if ((undefined1 *)local_278._0_8_ != local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          local_278._0_8_ = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"global","");
          cVar12 = (char)auStack_200._20_4_;
          if ((pbVar11->m_data).m_type == object) {
            iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_278);
            cVar12 = (char)auStack_200._20_4_;
            if ((_Rb_tree_header *)iVar5._M_node !=
                &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::operator[](pbVar11,(key_type *)local_278);
              local_198._M_dataplus._M_p = local_198._M_dataplus._M_p & 0xffffffffffffff00;
              nlohmann::json_abi_v3_11_3::detail::
              from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        (pvVar6,(boolean_t *)&local_198);
              cVar12 = (char)local_198._M_dataplus._M_p;
            }
          }
          if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
            operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
          }
          if (cVar12 == '\0') {
            local_60 = (ValueFederate *)local_1c8._8_8_;
            paStack_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_1c8._0_8_;
            units_04._M_str = (char *)local_1c8._0_8_;
            units_04._M_len = local_1c8._8_8_;
            name_01._M_str = local_1e8._M_dataplus._M_p;
            name_01._M_len = local_1e8._M_string_length;
            type_03._M_str = (char *)local_258._0_8_;
            type_03._M_len = local_258._8_8_;
            callback_01.inp =
                 registerInput((ValueFederate *)auStack_200._8_8_,name_01,type_03,units_04);
          }
          else {
            local_278._0_8_ = local_1c8._8_8_;
            local_278._8_8_ = local_1c8._0_8_;
            units_03._M_str = (char *)local_1c8._0_8_;
            units_03._M_len = local_1c8._8_8_;
            key_03._M_str = local_1e8._M_dataplus._M_p;
            key_03._M_len = local_1e8._M_string_length;
            type_02._M_str = (char *)local_258._0_8_;
            type_02._M_len = local_258._8_8_;
            callback_01.inp =
                 ValueFederateManager::registerInput
                           ((((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                               *)(auStack_200._8_8_ + 8))->_M_t).
                            super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                            .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                            _M_head_impl,key_03,type_02,units_03);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != &local_1b8) {
            operator_delete((void *)local_1c8._0_8_,
                            CONCAT17(local_1b8._M_local_buf[7],
                                     CONCAT43(local_1b8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_1b8._M_allocated_capacity._1_2_,
                                                       local_1b8._M_local_buf[0]))) + 1);
          }
          if ((Publication *)local_258._0_8_ != (Publication *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
          }
        }
        local_258._0_8_ = local_258 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"default","");
        if (((pbVar11->m_data).m_type == object) &&
           (iVar5 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(&((pbVar11->m_data).m_value.object)->_M_t,(key_type *)local_258),
           (_Rb_tree_header *)iVar5._M_node !=
           &(((pbVar11->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](pbVar11,(key_type *)local_258);
          if ((pvVar6->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_278,pvVar6);
          }
          else {
            fileops::generateJsonString((string *)local_278,pvVar6,true);
          }
        }
        else {
          local_278._0_8_ = local_268;
          local_278._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_268._0_8_ = local_268._0_8_ & 0xffffffffffffff00;
        }
        if ((Publication *)local_258._0_8_ != (Publication *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::
          variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
          ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       *)&(callback_01.inp)->lastValue,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278
                     );
        }
        loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>
                  ((ValueFederate *)auStack_200._8_8_,pbVar11,callback_01.inp);
        local_258._0_8_ = local_258 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"source","");
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"publications","");
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__2>
                  (pbVar11,(string *)local_258,&local_108,callback_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((Publication *)local_258._0_8_ != (Publication *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
        }
        local_258._0_8_ = local_258 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"source","");
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"targets","");
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__2>
                  (pbVar11,(string *)local_258,&local_128,callback_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((Publication *)local_258._0_8_ != (Publication *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,CONCAT71(local_258._17_7_,local_258[0x10]) + 1);
        }
        if ((ValueFederate *)local_278._0_8_ != (ValueFederate *)local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_1e8 + 0x10U)) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          CONCAT26(local_1e8.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_1e8.field_2._M_local_buf[5],
                                            CONCAT14(local_1e8.field_2._M_local_buf[4],
                                                     local_1e8.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if (*(char *)local_238._0_8_ == '\x02') {
          auStack_228._0_8_ = auStack_228._0_8_ + 0x10;
        }
        else if (*(char *)local_238._0_8_ == '\x01') {
          local_238._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_238._8_8_);
        }
        else {
          auStack_228._8_8_ = auStack_228._8_8_ + 1;
        }
        bVar4 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)local_238,
                           (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)local_218);
        this_01 = local_170;
      } while (!bVar4);
    }
  }
  if ((*this_01 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[7],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(this_01 + 8),(char (*) [7])0x3ec054),
     cVar8._M_node != (_Base_ptr)(*(long *)(this_01 + 8) + 8))) {
    local_278._0_8_ =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(this_01,"helics");
    registerValueInterfacesJsonDetail
              ((ValueFederate *)auStack_200._8_8_,(JsonBuffer *)local_278,(bool)auStack_200[0x14]);
  }
  return;
}

Assistant:

void ValueFederate::registerValueInterfacesJsonDetail(const fileops::JsonBuffer& jsonBuff,
                                                      bool defaultGlobal)
{
    const auto& json = jsonBuff.json();
    fileops::replaceIfMember(json, "defaultglobal", defaultGlobal);

    const nlohmann::json& iface = (json.contains("interfaces")) ? json["interfaces"] : json;

    if (iface.contains("publications")) {
        const auto& pubs = iface["publications"];
        for (const auto& pub : pubs) {
            auto name = fileops::getName(pub);

            Publication* pubAct = &vfManager->getPublication(name);
            if (!pubAct->isValid()) {
                auto type = fileops::getOrDefault(pub, "type", emptyStr);
                auto units = fileops::getOrDefault(pub, "unit", emptyStr);
                fileops::replaceIfMember(pub, "units", units);
                const bool global = fileops::getOrDefault(pub, "global", defaultGlobal);
                if (global) {
                    pubAct = &registerGlobalPublication(name, type, units);
                } else {
                    pubAct = &registerPublication(name, type, units);
                }
            }

            loadOptions(this, pub, *pubAct);
            auto addDestTarget = [pubAct](const std::string& target) {
                pubAct->addDestinationTarget(target);
            };
            addTargetVariations(pub, "destination", "inputs", addDestTarget);
            addTargetVariations(pub, "destination", "targets", addDestTarget);
        }
    }
    if (iface.contains("subscriptions")) {
        const auto& subs = iface["subscriptions"];
        for (const auto& sub : subs) {
            bool skipNameTarget{false};
            auto name = fileops::getName(sub);
            if (name.empty()) {
                fileops::replaceIfMember(sub, "target", name);
                skipNameTarget = true;
            }
            auto* subAct = &vfManager->getInputByTarget(name);
            if (!subAct->isValid()) {
                auto type = fileops::getOrDefault(sub, "type", emptyStr);
                auto units = fileops::getOrDefault(sub, "unit", emptyStr);
                fileops::replaceIfMember(sub, "units", units);
                subAct = &registerInput(emptyStr, type, units);
                if (!skipNameTarget) {
                    // this check is to prevent some warnings since targets get added later
                    subAct->addTarget(name);
                }
            }
            auto defStr = fileops::getOrDefault(sub, "default", emptyStr);
            if (!defStr.empty()) {
                subAct->setDefault(defStr);
            }
            loadOptions(this, sub, *subAct);
            auto addSourceTarget = [subAct](const std::string& target) {
                subAct->addSourceTarget(target);
            };
            addTargetVariations(sub, "source", "publications", addSourceTarget);
            addTargetVariations(sub, "source", "targets", addSourceTarget);
        }
    }
    if (iface.contains("inputs")) {
        const auto& ipts = iface["inputs"];
        for (const auto& ipt : ipts) {
            auto name = fileops::getName(ipt);

            Input* inp = &vfManager->getInput(name);
            if (!inp->isValid()) {
                auto type = fileops::getOrDefault(ipt, "type", emptyStr);
                auto units = fileops::getOrDefault(ipt, "unit", emptyStr);
                fileops::replaceIfMember(ipt, "units", units);
                const bool global = fileops::getOrDefault(ipt, "global", defaultGlobal);
                if (global) {
                    inp = &registerGlobalInput(name, type, units);
                } else {
                    inp = &registerInput(name, type, units);
                }
            }
            auto defStr = fileops::getOrDefault(ipt, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, ipt, *inp);
            auto addSourceTarget = [inp](const std::string& target) {
                inp->addSourceTarget(target);
            };
            addTargetVariations(ipt, "source", "publications", addSourceTarget);
            addTargetVariations(ipt, "source", "targets", addSourceTarget);
        }
    }

    if (json.contains("helics")) {
        registerValueInterfacesJsonDetail(json["helics"], defaultGlobal);
    }
}